

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_list.h
# Opt level: O0

ngx_int_t ngx_list_init(ngx_list_t *list,ngx_pool_t *pool,ngx_uint_t n,size_t size)

{
  void *pvVar1;
  size_t size_local;
  ngx_uint_t n_local;
  ngx_pool_t *pool_local;
  ngx_list_t *list_local;
  
  pvVar1 = ngx_palloc(pool,n * size);
  (list->part).elts = pvVar1;
  if ((list->part).elts == (void *)0x0) {
    list_local = (ngx_list_t *)0xffffffffffffffff;
  }
  else {
    (list->part).nelts = 0;
    (list->part).next = (ngx_list_part_t *)0x0;
    list->last = &list->part;
    list->size = size;
    list->nalloc = n;
    list->pool = pool;
    list_local = (ngx_list_t *)0x0;
  }
  return (ngx_int_t)list_local;
}

Assistant:

static ngx_inline ngx_int_t
ngx_list_init(ngx_list_t *list, ngx_pool_t *pool, ngx_uint_t n, size_t size)
{
    list->part.elts = ngx_palloc(pool, n * size);
    if (list->part.elts == NULL) {
        return NGX_ERROR;
    }

    list->part.nelts = 0;
    list->part.next = NULL;
    list->last = &list->part;
    list->size = size;
    list->nalloc = n;
    list->pool = pool;

    return NGX_OK;
}